

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O0

bool __thiscall psy::C::Parser::parseArrayDesignator_AtFirst(Parser *this,DesignatorSyntax **desig)

{
  bool bVar1;
  SyntaxKind SVar2;
  SyntaxToken *this_00;
  ostream *poVar3;
  ArrayDesignatorSyntax *pAVar4;
  IndexType IVar5;
  bool local_31;
  ArrayDesignatorSyntax *arrDesig;
  DesignatorSyntax **desig_local;
  Parser *this_local;
  
  this_00 = peek(this,1);
  SVar2 = SyntaxToken::kind(this_00);
  if (SVar2 == OpenBracketToken) {
    pAVar4 = makeNode<psy::C::ArrayDesignatorSyntax>(this);
    *desig = &pAVar4->super_DesignatorSyntax;
    IVar5 = consume(this);
    pAVar4->openBracketTkIdx_ = IVar5;
    bVar1 = parseExpressionWithPrecedenceConditional(this,&pAVar4->expr_);
    local_31 = false;
    if (bVar1) {
      local_31 = matchOrSkipTo(this,CloseBracketToken,&pAVar4->closeBracketTkIdx_);
    }
    this_local._7_1_ = local_31;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Declarations.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x9fd);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"assert failure: `[\'");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::parseArrayDesignator_AtFirst(DesignatorSyntax*& desig)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::OpenBracketToken,
                  return false,
                  "assert failure: `['");

    auto arrDesig = makeNode<ArrayDesignatorSyntax>();
    desig = arrDesig;
    arrDesig->openBracketTkIdx_ = consume();

    return parseExpressionWithPrecedenceConditional(arrDesig->expr_)
                && matchOrSkipTo(SyntaxKind::CloseBracketToken, &arrDesig->closeBracketTkIdx_);
}